

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Tracer_testTracerSimpleChild_Test::TestBody(Tracer_testTracerSimpleChild_Test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined **ppuVar1;
  char cVar2;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  AssertionResult gtest_ar_;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  long *local_80;
  long *local_78;
  long *local_70;
  AssertHelper local_68 [8];
  AssertionResult *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined **local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined *local_40 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  ppuVar1 = local_50;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_44,local_48);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (CONCAT44(uStack_44,local_48) == 0) goto LAB_00192275;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_44,local_48));
  }
LAB_00192275:
  operation_name.length_ = (size_t)"test-simple-root";
  operation_name.data_ = (char *)ppuVar1;
  opentracing::v3::Tracer::StartSpan
            ((Tracer *)&local_70,operation_name,
             (initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>)
             ZEXT816(0x10));
  local_60 = (AssertionResult *)CONCAT71(local_60._1_7_,local_70 != (long *)0x0);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 == (long *)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,(char *)&local_60,"spanRoot","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1f8,(char *)local_50);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40[0] = (undefined *)(**(code **)(*local_70 + 0x50))();
    local_50 = &PTR__StartSpanOption_0020b2a8;
    local_48 = 1;
    operation_name_00.length_ = (size_t)"test-simple-child";
    operation_name_00.data_ = (char *)ppuVar1;
    option_list._M_len = (size_type)&local_60;
    option_list._M_array = (iterator)0x11;
    local_60 = (AssertionResult *)&local_50;
    opentracing::v3::Tracer::StartSpan((Tracer *)&local_78,operation_name_00,option_list);
    local_60 = (AssertionResult *)CONCAT71(local_60._1_7_,local_78 != (long *)0x0);
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_78 != (long *)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      (**(code **)(*ppuVar1 + 0x58))(ppuVar1);
      goto LAB_001924d9;
    }
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_50,(char *)&local_60,"spanChild","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1fb,(char *)local_50);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
LAB_001924d9:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Tracer, testTracerSimpleChild)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        auto spanRoot = tracer->StartSpan("test-simple-root");
        ASSERT_TRUE(spanRoot);
        auto spanChild = tracer->StartSpan("test-simple-child",
            { opentracing::ChildOf(&spanRoot->context()) });
        ASSERT_TRUE(spanChild);
    }
    tracer->Close();
}